

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int VP8EncLoop(VP8Encoder *enc)

{
  int iVar1;
  uint uVar2;
  long in_RDI;
  VP8RDLevel rd_opt;
  int dont_use_skip;
  VP8ModeScore info;
  int ok;
  VP8EncIterator it;
  VP8EncIterator *in_stack_ffffffffffffed58;
  undefined4 in_stack_ffffffffffffed60;
  VP8RDLevel in_stack_ffffffffffffed64;
  undefined4 in_stack_ffffffffffffed68;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffed6c;
  undefined4 in_stack_ffffffffffffed70;
  int in_stack_ffffffffffffed74;
  VP8EncIterator *in_stack_ffffffffffffed78;
  VP8EncIterator *in_stack_ffffffffffffed80;
  VP8EncIterator *in_stack_ffffffffffffed90;
  uint8_t *in_stack_ffffffffffffed98;
  VP8EncIterator *in_stack_ffffffffffffeda0;
  VP8EncIterator *in_stack_ffffffffffffedb0;
  VP8ModeScore *in_stack_ffffffffffffedc0;
  VP8EncIterator *in_stack_ffffffffffffedc8;
  VP8BitWriter *in_stack_ffffffffffffedd0;
  VP8Encoder *in_stack_ffffffffffffedd8;
  VP8EncIterator local_f18;
  long local_10;
  int local_4;
  
  local_10 = in_RDI;
  iVar1 = PreLoopInitialize((VP8Encoder *)
                            CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    StatLoop(in_stack_ffffffffffffedd8);
    VP8IteratorInit((VP8Encoder *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                    in_stack_ffffffffffffed58);
    VP8InitFilter((VP8EncIterator *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
    do {
      uVar2 = (uint)((*(int *)(local_10 + 0x5bcc) != 0 ^ 0xffU) & 1);
      uVar3 = *(undefined4 *)(local_10 + 0x5c44);
      VP8IteratorImport(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
      iVar1 = VP8Decimate((VP8EncIterator *)
                          CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                          (VP8ModeScore *)CONCAT44(uVar2,uVar3),in_stack_ffffffffffffed64);
      if ((iVar1 == 0) || (uVar2 != 0)) {
        CodeResiduals(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0)
        ;
        if ((local_f18.bw)->error != 0) break;
      }
      else {
        ResetAfterSkip(&local_f18);
      }
      StoreSideInfo(in_stack_ffffffffffffed90);
      VP8StoreFilterStats(in_stack_ffffffffffffed80);
      VP8IteratorExport(in_stack_ffffffffffffedb0);
      iVar1 = VP8IteratorProgress(in_stack_ffffffffffffed78,in_stack_ffffffffffffed74);
      VP8IteratorSaveBoundary(&local_f18);
      in_stack_ffffffffffffed64 = in_stack_ffffffffffffed64 & 0xffffff;
      if (iVar1 != 0) {
        iVar1 = VP8IteratorNext((VP8EncIterator *)0x176f5f);
        in_stack_ffffffffffffed64 = CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffed64);
      }
    } while ((char)(in_stack_ffffffffffffed64 >> 0x18) != '\0');
    local_4 = PostLoopFinalize(in_stack_ffffffffffffed78,in_stack_ffffffffffffed74);
  }
  return local_4;
}

Assistant:

int VP8EncLoop(VP8Encoder* const enc) {
  VP8EncIterator it;
  int ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  StatLoop(enc);  // stats-collection loop

  VP8IteratorInit(enc, &it);
  VP8InitFilter(&it);
  do {
    VP8ModeScore info;
    const int dont_use_skip = !enc->proba.use_skip_proba;
    const VP8RDLevel rd_opt = enc->rd_opt_level;

    VP8IteratorImport(&it, NULL);
    // Warning! order is important: first call VP8Decimate() and
    // *then* decide how to code the skip decision if there's one.
    if (!VP8Decimate(&it, &info, rd_opt) || dont_use_skip) {
      CodeResiduals(it.bw, &it, &info);
      if (it.bw->error) {
        // enc->pic->error_code is set in PostLoopFinalize().
        ok = 0;
        break;
      }
    } else {   // reset predictors after a skip
      ResetAfterSkip(&it);
    }
    StoreSideInfo(&it);
    VP8StoreFilterStats(&it);
    VP8IteratorExport(&it);
    ok = VP8IteratorProgress(&it, 20);
    VP8IteratorSaveBoundary(&it);
  } while (ok && VP8IteratorNext(&it));

  return PostLoopFinalize(&it, ok);
}